

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int setjitmode(lua_State *L,int mode)

{
  uint32_t uVar1;
  TValue *pTVar2;
  int iVar3;
  
  pTVar2 = L->base;
  iVar3 = 0;
  if (pTVar2 != L->top) {
    uVar1 = (pTVar2->field_2).it;
    if (uVar1 + 9 < 2) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
      if (uVar1 == 0xffffffff) goto LAB_0012214c;
      if (uVar1 != 0xfffffffd) goto LAB_00122174;
      iVar3 = 0;
    }
    if ((pTVar2 + 1 < L->top) && (*(int *)((long)pTVar2 + 0xc) + 3U < 2)) {
      mode = mode | (*(int *)((long)pTVar2 + 0xc) == -2) + 3;
    }
    else {
      mode = mode | 2;
    }
  }
LAB_0012214c:
  iVar3 = luaJIT_setmode(L,iVar3,mode);
  if (iVar3 == 1) {
    return 1;
  }
  if ((char)mode == '\0') {
    lj_err_caller(L,LJ_ERR_NOJIT);
  }
LAB_00122174:
  lj_err_argt(L,1,6);
}

Assistant:

static int setjitmode(lua_State *L, int mode)
{
  int idx = 0;
  if (L->base == L->top || tvisnil(L->base)) {  /* jit.on/off/flush([nil]) */
    mode |= LUAJIT_MODE_ENGINE;
  } else {
    /* jit.on/off/flush(func|proto, nil|true|false) */
    if (tvisfunc(L->base) || tvisproto(L->base))
      idx = 1;
    else if (!tvistrue(L->base))  /* jit.on/off/flush(true, nil|true|false) */
      goto err;
    if (L->base+1 < L->top && tvisbool(L->base+1))
      mode |= boolV(L->base+1) ? LUAJIT_MODE_ALLFUNC : LUAJIT_MODE_ALLSUBFUNC;
    else
      mode |= LUAJIT_MODE_FUNC;
  }
  if (luaJIT_setmode(L, idx, mode) != 1) {
    if ((mode & LUAJIT_MODE_MASK) == LUAJIT_MODE_ENGINE)
      lj_err_caller(L, LJ_ERR_NOJIT);
  err:
    lj_err_argt(L, 1, LUA_TFUNCTION);
  }
  return 0;
}